

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::DielectricMaterial> *material,ssize_t id)

{
  int __oflag;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"material",&local_b9);
  std::__cxx11::string::string
            (local_58,(string *)&(material->ptr->super_MaterialNode).super_Node.name);
  open(this,(char *)local_38,(int)id,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  store(this,"code","Dielectric");
  std::__cxx11::string::string(local_78,"parameters",&local_b9);
  open(this,(char *)local_78,__oflag);
  std::__cxx11::string::~string(local_78);
  store_parm(this,"transmissionOutside",&material->ptr->transmissionOutside);
  store_parm(this,"transmission",&material->ptr->transmissionInside);
  store_parm(this,"etaOutside",&material->ptr->etaOutside);
  store_parm(this,"etaInside",&material->ptr->etaInside);
  std::__cxx11::string::string(local_98,"parameters",&local_b9);
  close(this,(int)local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::string(local_b8,"material",&local_b9);
  close(this,(int)local_b8);
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

void XMLWriter::store(Ref<DielectricMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","Dielectric");
    open("parameters");
    store_parm("transmissionOutside",material->transmissionOutside);
    store_parm("transmission",material->transmissionInside);
    store_parm("etaOutside",material->etaOutside);
    store_parm("etaInside",material->etaInside);
    close("parameters");
    close("material");
  }